

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O3

void Acb_ParSetDefault(Acb_Par_t *pPars)

{
  pPars->nLutSize = 4;
  pPars->nTfoLevMax = 2;
  pPars->nTfiLevMax = 3;
  pPars->nFanoutMax = 0x14;
  pPars->nWinNodeMax = 100;
  pPars->nGrowthLevel = 0;
  pPars->nBTLimit = 0;
  pPars->nNodesMax = 0;
  pPars->fUseAshen = 0;
  pPars->iNodeOne = 0;
  pPars->fArea = 1;
  pPars->fMoreEffort = 0;
  pPars->fVerbose = 0;
  pPars->fVeryVerbose = 0;
  return;
}

Assistant:

void Acb_ParSetDefault( Acb_Par_t * pPars )
{
    memset( pPars, 0, sizeof(Acb_Par_t) );
    pPars->nLutSize     =    4;    // LUT size
    pPars->nTfoLevMax   =    2;    // the maximum fanout levels
    pPars->nTfiLevMax   =    3;    // the maximum fanin levels
    pPars->nFanoutMax   =   20;    // the maximum number of fanouts
    pPars->nWinNodeMax  =  100;    // the maximum number of nodes in the window
    pPars->nGrowthLevel =    0;    // the maximum allowed growth in level
    pPars->nBTLimit     =    0;    // the maximum number of conflicts in one SAT run
    pPars->nNodesMax    =    0;    // the maximum number of nodes to try
    pPars->iNodeOne     =    0;    // one particular node to try
    pPars->fArea        =    1;    // performs optimization for area
    pPars->fUseAshen    =    0;    // use Ashenhurst decomposition
    pPars->fMoreEffort  =    0;    // enables using more effort
    pPars->fVerbose     =    0;    // enable basic stats
    pPars->fVeryVerbose =    0;    // enable detailed stats
}